

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O3

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::addProgram
          (BinaryRegistryWriter *this,ProgramIdentifier *id,ProgramBinary *binary)

{
  size_t *psVar1;
  deUint32 index;
  deUint32 *pdVar2;
  ProgramIdentifierIndex local_68;
  
  pdVar2 = BinaryIndexHashImpl_find((this->m_binaryHash).m_hash,binary);
  if (pdVar2 == (deUint32 *)0x0) {
    index = getNextSlot(this);
    addBinary(this,index,binary);
  }
  else {
    index = *pdVar2;
  }
  psVar1 = &(this->m_binaries).
            super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
            ._M_impl.super__Vector_impl_data._M_start[index].referenceCount;
  *psVar1 = *psVar1 + 1;
  ProgramIdentifierIndex::ProgramIdentifierIndex(&local_68,id,index);
  std::
  vector<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
  ::emplace_back<vk::BinaryRegistryDetail::ProgramIdentifierIndex>(&this->m_binaryIndices,&local_68)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.id.programName._M_dataplus._M_p != &local_68.id.programName.field_2) {
    operator_delete(local_68.id.programName._M_dataplus._M_p,
                    local_68.id.programName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.id.testCasePath._M_dataplus._M_p != &local_68.id.testCasePath.field_2) {
    operator_delete(local_68.id.testCasePath._M_dataplus._M_p,
                    local_68.id.testCasePath.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BinaryRegistryWriter::addProgram (const ProgramIdentifier& id, const ProgramBinary& binary)
{
	const deUint32* const	indexPtr	= findBinary(binary);
	deUint32				index		= indexPtr ? *indexPtr : ~0u;

	if (!indexPtr)
	{
		index = getNextSlot();
		addBinary(index, binary);
	}

	m_binaries[index].referenceCount += 1;
	m_binaryIndices.push_back(ProgramIdentifierIndex(id, index));
}